

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# A_Star_Test.cpp
# Opt level: O0

void __thiscall
Build_Map_Node_Creation_Check_Test::TestBody(Build_Map_Node_Creation_Check_Test *this)

{
  allocator<int> *this_00;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  bool bVar1;
  char *message;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> Built_Node;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> Test_Node;
  allocator<double> local_59;
  double local_58 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> Points;
  Build_Map_Node_Creation_Check_Test *this_local;
  
  local_58[2] = 2.0;
  local_58[0] = 2.0;
  local_58[1] = 2.0;
  local_38 = local_58;
  local_30 = 3;
  Points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<double>::allocator(&local_59);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l_00,&local_59);
  std::allocator<double>::~allocator(&local_59);
  Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 2;
  this_00 = (allocator<int> *)
            ((long)&Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(this_00);
  __l._M_len = 3;
  __l._M_array = (iterator)
                 ((long)&Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,__l,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&Built_Node.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&gtest_ar.message_,
             (vector<double,_std::allocator<double>_> *)local_28);
  Build_Map::Build_Node
            ((vector<int,_std::allocator<int>_> *)local_c0,&Map,
             (vector<double,_std::allocator<double>_> *)&gtest_ar.message_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::
  Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((EqHelper<false> *)local_e8,"Built_Node","Test_Node",
             (vector<int,_std::allocator<int>_> *)local_c0,
             (vector<int,_std::allocator<int>_> *)local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/test/A_Star_Test.cpp"
               ,0x5b,message);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return;
}

Assistant:

TEST(Build_Map, Node_Creation_Check) {
  std::vector<double> Points = { 2, 2, 2 };
  std::vector<int> Test_Node = { 2, 2, 2 };
  std::vector<int> Built_Node = Map.Build_Node(Points);
  ASSERT_EQ(Built_Node, Test_Node);
}